

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::getCreateSubBufferArgsString
          (CLIntercept *this,cl_buffer_create_type createType,void *createInfo,string *str)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  cl_buffer_region *pRegion;
  ostringstream ss;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if (createType == 0x1220) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"region = ",9);
    if (createInfo != (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{ origin = ",0xb);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", size = ",9);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
      goto LAB_0016ce8c;
    }
    lVar2 = 6;
    pcVar3 = "(NULL)";
  }
  else {
    lVar2 = 0xd;
    pcVar3 = "<Unexpected!>";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,lVar2);
LAB_0016ce8c:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)str,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void CLIntercept::getCreateSubBufferArgsString(
    cl_buffer_create_type createType,
    const void *createInfo,
    std::string& str ) const
{
    std::ostringstream  ss;

    switch( createType )
    {
    case CL_BUFFER_CREATE_TYPE_REGION:
        ss << "region = ";
        if( createInfo != NULL )
        {
            cl_buffer_region*   pRegion = (cl_buffer_region*)createInfo;
            ss << "{ origin = "
                << pRegion->origin
                << ", size = "
                << pRegion->size
                << " }";
        }
        else
        {
            ss << "(NULL)";
        }
        break;
    default:
        ss << "<Unexpected!>";
        break;
    }

    str = ss.str();
}